

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::RepeatedFieldHelper<6>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  int iVar1;
  RepeatedField<unsigned_long> *this;
  unsigned_long *ptr;
  int local_2c;
  int i;
  RepeatedField<unsigned_long> *array;
  CodedOutputStream *output_local;
  FieldMetadata *md_local;
  void *field_local;
  
  this = Get<google::protobuf::RepeatedField<unsigned_long>>(field);
  local_2c = 0;
  while( true ) {
    iVar1 = RepeatedField<unsigned_long>::size(this);
    if (iVar1 <= local_2c) break;
    WriteTagTo<google::protobuf::io::CodedOutputStream>(md->tag,output);
    ptr = RepeatedField<unsigned_long>::operator[](this,local_2c);
    SerializeTo<6,google::protobuf::io::CodedOutputStream>(ptr,output);
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    typedef typename PrimitiveTypeHelper<type>::Type T;
    const RepeatedField<T>& array = Get<RepeatedField<T> >(field);
    for (int i = 0; i < array.size(); i++) {
      WriteTagTo(md.tag, output);
      SerializeTo<type>(&array[i], output);
    }
  }